

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Abc_Obj_t * Abc_ObjFanin1Ivy(Abc_Ntk_t *p,Ivy_Obj_t *pObj)

{
  int c;
  Ivy_Obj_t *pIVar1;
  Abc_Obj_t *pAVar2;
  Ivy_Obj_t *pObj_local;
  Abc_Ntk_t *p_local;
  
  pIVar1 = Ivy_ObjFanin1(pObj);
  pAVar2 = Abc_EdgeToNode(p,pIVar1->TravId);
  c = Ivy_ObjFaninC1(pObj);
  pAVar2 = Abc_ObjNotCond(pAVar2,c);
  return pAVar2;
}

Assistant:

static inline Abc_Obj_t *  Abc_ObjFanin1Ivy( Abc_Ntk_t * p, Ivy_Obj_t * pObj ) { return Abc_ObjNotCond( Abc_EdgeToNode(p, Ivy_ObjFanin1(pObj)->TravId), Ivy_ObjFaninC1(pObj) ); }